

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O0

logical pnga_patch_intersect(Integer *lo,Integer *hi,Integer *lop,Integer *hip,Integer ndim)

{
  Integer local_48;
  Integer local_40;
  Integer i;
  Integer ndim_local;
  Integer *hip_local;
  Integer *lop_local;
  Integer *hi_local;
  Integer *lo_local;
  
  i = 0;
  while( true ) {
    if (ndim <= i) {
      i = 0;
      while( true ) {
        if (ndim <= i) {
          for (i = 0; i < ndim; i = i + 1) {
            if (lo[i] < lop[i]) {
              local_40 = lop[i];
            }
            else {
              local_40 = lo[i];
            }
            lop[i] = local_40;
            if (hip[i] < hi[i]) {
              local_48 = hip[i];
            }
            else {
              local_48 = hi[i];
            }
            hip[i] = local_48;
          }
          return 1;
        }
        if (hi[i] < lop[i]) break;
        if (hip[i] < lo[i]) {
          return 0;
        }
        i = i + 1;
      }
      return 0;
    }
    if (hi[i] < lo[i]) {
      return 0;
    }
    if (hip[i] < lop[i]) break;
    i = i + 1;
  }
  return 0;
}

Assistant:

logical pnga_patch_intersect(Integer *lo, Integer *hi,
                        Integer *lop, Integer *hip, Integer ndim)
{
    Integer i;
    
    /* check consistency of patch coordinates */
    for(i=0; i<ndim; i++) {
        if(hi[i] < lo[i]) return FALSE; /* inconsistent */
        if(hip[i] < lop[i]) return FALSE; /* inconsistent */
    }
    
    /* find the intersection and update (ilop: ihip, jlop: jhip) */
    for(i=0; i<ndim; i++) {
        if(hi[i] < lop[i]) return FALSE; /* don't intersect */
        if(hip[i] < lo[i]) return FALSE; /* don't intersect */
    }
    
    for(i=0; i<ndim; i++) {
        lop[i] = GA_MAX(lo[i], lop[i]);
        hip[i] = GA_MIN(hi[i], hip[i]);
    }
    
    return TRUE;
}